

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::draw(Dialog *this)

{
  int iVar1;
  Widget *this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  reference ppWVar5;
  long in_RDI;
  Widget *wid;
  iterator it;
  int ch;
  int cw;
  int cy;
  int cx;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  _Self local_28;
  _Self local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c [3];
  
  al_get_clipping_rectangle(local_c,&local_10,&local_14,&local_18);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::begin
                 ((list<Widget_*,_std::allocator<Widget_*>_> *)
                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::end
                   ((list<Widget_*,_std::allocator<Widget_*>_> *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    ppWVar5 = std::_List_iterator<Widget_*>::operator*((_List_iterator<Widget_*> *)0x10be81);
    this_00 = *ppWVar5;
    in_stack_ffffffffffffffbc = this_00->x1;
    iVar1 = this_00->y1;
    uVar3 = Widget::width(this_00);
    uVar4 = Widget::height(this_00);
    al_set_clipping_rectangle(in_stack_ffffffffffffffbc,iVar1,uVar3,uVar4);
    (*this_00->_vptr_Widget[0xe])();
    std::_List_iterator<Widget_*>::operator++(&local_20);
  }
  al_set_clipping_rectangle(local_c[0],local_10,local_14,local_18);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

void Dialog::draw()
{
   int cx, cy, cw, ch;
   al_get_clipping_rectangle(&cx, &cy, &cw, &ch);

   for (std::list<Widget *>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      Widget *wid = (*it);
      al_set_clipping_rectangle(wid->x1, wid->y1, wid->width(), wid->height());
      wid->draw();
   }

   al_set_clipping_rectangle(cx, cy, cw, ch);

   this->draw_requested = false;
}